

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint32_t brotli::HashLongestMatchQuickly<16,_1,_true>::HashBytes(uint8_t *data)

{
  uint64_t uVar1;
  uint64_t h;
  uint8_t *data_local;
  
  uVar1 = BROTLI_UNALIGNED_LOAD64(data);
  return (uint32_t)(ushort)(uVar1 * 0x1e35a7bd000000 >> 0x30);
}

Assistant:

static uint32_t HashBytes(const uint8_t *data) {
    // Computing a hash based on 5 bytes works much better for
    // qualities 1 and 3, where the next hash value is likely to replace
    uint64_t h = (BROTLI_UNALIGNED_LOAD64(data) << 24) * kHashMul32;
    // The higher bits contain more mixture from the multiplication,
    // so we take our results from there.
    return static_cast<uint32_t>(h >> (64 - kBucketBits));
  }